

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_xrstor_x86_64(CPUX86State *env,target_ulong ptr,uint64_t rfbm)

{
  uint32_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  CPUState *cpu;
  uintptr_t unaff_retaddr;
  CPUState *cs;
  uint64_t old_pkru;
  uint64_t reserve0;
  uint64_t xcomp_bv;
  uint64_t xstate_bv;
  uintptr_t ra;
  uint64_t rfbm_local;
  target_ulong ptr_local;
  CPUX86State *env_local;
  
  uVar2 = env->xcr0 & rfbm;
  if ((env->cr[4] & 0x40000) == 0) {
    raise_exception_ra_x86_64(env,6,unaff_retaddr);
  }
  if ((ptr & 0x3f) != 0) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  uVar3 = cpu_ldq_data_ra_x86_64(env,ptr + 0x200,unaff_retaddr);
  if ((long)uVar3 < 0) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  if ((uVar3 & (env->xcr0 ^ 0xffffffffffffffff)) == 0) {
    uVar4 = cpu_ldq_data_ra_x86_64(env,ptr + 0x208,unaff_retaddr);
    uVar5 = cpu_ldq_data_ra_x86_64(env,ptr + 0x210,unaff_retaddr);
    if ((uVar4 == 0) && (uVar5 == 0)) {
      if ((uVar2 & 1) != 0) {
        if ((uVar3 & 1) == 0) {
          do_fninit(env);
          memset(env->fpregs,0,0x80);
        }
        else {
          do_xrstor_fpu(env,ptr,unaff_retaddr);
        }
      }
      if ((uVar2 & 2) != 0) {
        do_xrstor_mxcsr(env,ptr,unaff_retaddr);
        if ((uVar3 & 2) == 0) {
          memset(env->xmm_regs,0,0x800);
        }
        else {
          do_xrstor_sse(env,ptr,unaff_retaddr);
        }
      }
      if ((uVar2 & 8) != 0) {
        if ((uVar3 & 8) == 0) {
          memset(env->bnd_regs,0,0x40);
          env->hflags = env->hflags & 0xfbffffff;
        }
        else {
          do_xrstor_bndregs(env,ptr + 0x3c0,unaff_retaddr);
          env->hflags = env->hflags | 0x4000000;
        }
      }
      if ((uVar2 & 0x10) != 0) {
        if ((uVar3 & 0x10) == 0) {
          memset(&env->bndcs_regs,0,0x10);
        }
        else {
          do_xrstor_bndcsr(env,ptr + 0x400,unaff_retaddr);
        }
        cpu_sync_bndcs_hflags_x86_64(env);
      }
      if ((uVar2 & 0x200) != 0) {
        uVar1 = env->pkru;
        if ((uVar3 & 0x200) == 0) {
          env->pkru = 0;
        }
        else {
          do_xrstor_pkru(env,ptr + 0xa80,unaff_retaddr);
        }
        if (env->pkru != uVar1) {
          cpu = env_cpu(env);
          tlb_flush_x86_64(cpu);
        }
      }
      return;
    }
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
}

Assistant:

void helper_xrstor(CPUX86State *env, target_ulong ptr, uint64_t rfbm)
{
    uintptr_t ra = GETPC();
    uint64_t xstate_bv, xcomp_bv, reserve0;

    rfbm &= env->xcr0;

    /* The OS must have enabled XSAVE.  */
    if (!(env->cr[4] & CR4_OSXSAVE_MASK)) {
        raise_exception_ra(env, EXCP06_ILLOP, ra);
    }

    /* The operand must be 64 byte aligned.  */
    if (ptr & 63) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    xstate_bv = cpu_ldq_data_ra(env, ptr + XO(header.xstate_bv), ra);

    if ((int64_t)xstate_bv < 0) {
        /* FIXME: Compact form.  */
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    /* Standard form.  */

    /* The XSTATE_BV field must not set bits not present in XCR0.  */
    if (xstate_bv & ~env->xcr0) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    /* The XCOMP_BV field must be zero.  Note that, as of the April 2016
       revision, the description of the XSAVE Header (Vol 1, Sec 13.4.2)
       describes only XCOMP_BV, but the description of the standard form
       of XRSTOR (Vol 1, Sec 13.8.1) checks bytes 23:8 for zero, which
       includes the next 64-bit field.  */
    xcomp_bv = cpu_ldq_data_ra(env, ptr + XO(header.xcomp_bv), ra);
    reserve0 = cpu_ldq_data_ra(env, ptr + XO(header.reserve0), ra);
    if (xcomp_bv || reserve0) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    if (rfbm & XSTATE_FP_MASK) {
        if (xstate_bv & XSTATE_FP_MASK) {
            do_xrstor_fpu(env, ptr, ra);
        } else {
            do_fninit(env);
            memset(env->fpregs, 0, sizeof(env->fpregs));
        }
    }
    if (rfbm & XSTATE_SSE_MASK) {
        /* Note that the standard form of XRSTOR loads MXCSR from memory
           whether or not the XSTATE_BV bit is set.  */
        do_xrstor_mxcsr(env, ptr, ra);
        if (xstate_bv & XSTATE_SSE_MASK) {
            do_xrstor_sse(env, ptr, ra);
        } else {
            /* ??? When AVX is implemented, we may have to be more
               selective in the clearing.  */
            memset(env->xmm_regs, 0, sizeof(env->xmm_regs));
        }
    }
    if (rfbm & XSTATE_BNDREGS_MASK) {
        if (xstate_bv & XSTATE_BNDREGS_MASK) {
            do_xrstor_bndregs(env, ptr + XO(bndreg_state), ra);
            env->hflags |= HF_MPX_IU_MASK;
        } else {
            memset(env->bnd_regs, 0, sizeof(env->bnd_regs));
            env->hflags &= ~HF_MPX_IU_MASK;
        }
    }
    if (rfbm & XSTATE_BNDCSR_MASK) {
        if (xstate_bv & XSTATE_BNDCSR_MASK) {
            do_xrstor_bndcsr(env, ptr + XO(bndcsr_state), ra);
        } else {
            memset(&env->bndcs_regs, 0, sizeof(env->bndcs_regs));
        }
        cpu_sync_bndcs_hflags(env);
    }
    if (rfbm & XSTATE_PKRU_MASK) {
        uint64_t old_pkru = env->pkru;
        if (xstate_bv & XSTATE_PKRU_MASK) {
            do_xrstor_pkru(env, ptr + XO(pkru_state), ra);
        } else {
            env->pkru = 0;
        }
        if (env->pkru != old_pkru) {
            CPUState *cs = env_cpu(env);
            tlb_flush(cs);
        }
    }
}